

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfp.c
# Opt level: O0

int sfp_get_om4_length_copper_length(tcv_t *tcv)

{
  _Bool _Var1;
  uint local_20;
  byte local_19;
  uchar length;
  tcv_t *tcv_local;
  
  if ((tcv == (tcv_t *)0x0) || (tcv->data == (void *)0x0)) {
    tcv_local._4_4_ = 0xfffffffc;
  }
  else {
    _Var1 = sfp_is_optical(tcv);
    if (_Var1) {
      local_19 = *(char *)((long)tcv->data + 0x13) * '\n';
    }
    else {
      local_19 = *(byte *)((long)tcv->data + 0x13);
    }
    if (local_19 == 0) {
      local_20 = 0xfffffff6;
    }
    else {
      local_20 = (uint)local_19;
    }
    tcv_local._4_4_ = local_20;
  }
  return tcv_local._4_4_;
}

Assistant:

int sfp_get_om4_length_copper_length(tcv_t *tcv)
{
	unsigned char length;

	if (tcv == NULL || tcv->data == NULL)
		return TCV_ERR_INVALID_ARG;

	/* Normalize length to meters. Optical link is measured in units of 10 meters
	 * and copper link is measured in units of 1 meter. */
	if (sfp_is_optical(tcv))
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_OM4_10M_COPPER_1M] * 10;
	else
		length = ((sfp_data_t*)tcv->data)->a0[BASIC_INFO_REG_LENGTH_OM4_10M_COPPER_1M];

	return length == 0 ? TCV_ERR_OM4_LENGTH_NOT_DEFINED : length;
}